

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

iterator __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
::find<std::__cxx11::string>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key,size_t hash)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  anon_union_8_1_a8a14541_for_iterator_1 unaff_RBP;
  ulong uVar8;
  ctrl_t *pcVar9;
  ulong uVar10;
  undefined1 auVar11 [64];
  iterator iVar12;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_int_&>_>
  local_78;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar1 = *(ulong *)(this + 0x18);
  uVar10 = hash >> 7;
  auVar2 = vpbroadcastb_avx512vl();
  auVar11 = ZEXT1664(auVar2);
  lVar7 = 0;
  do {
    uVar10 = uVar10 & uVar1;
    local_58 = *(undefined1 (*) [16])(*(long *)this + uVar10);
    local_48 = auVar11._0_16_;
    uVar8 = vpcmpeqb_avx512vl(local_48,local_58);
    if ((short)uVar8 != 0) {
      do {
        uVar3 = 0;
        uVar6 = (uint)uVar8;
        for (uVar4 = uVar6; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
          uVar3 = uVar3 + 1;
        }
        uVar8 = uVar3 + uVar10 & uVar1;
        unaff_RBP.slot_ = (slot_type *)(uVar8 * 5);
        local_78.first.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              )(*(long *)(this + 8) + uVar8 * 0x28);
        local_78.second.super__Tuple_impl<0UL,_const_int_&>.
        super__Head_base<0UL,_const_int_&,_false>._M_head_impl =
             (_Tuple_impl<0UL,_const_int_&>)(*(long *)(this + 8) + 0x20 + uVar8 * 0x28);
        local_68.rhs = key;
        local_68.eq = (key_equal *)(this + 0x28);
        bVar5 = memory_internal::
                DecomposePairImpl<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<int_const&>>
                          (&local_68,&local_78);
        if (bVar5) {
          pcVar9 = (ctrl_t *)(uVar8 + *(long *)this);
          unaff_RBP.slot_ = (slot_type *)(uVar8 * 0x28 + *(long *)(this + 8));
          goto LAB_0016d709;
        }
        auVar11 = ZEXT1664(local_48);
        uVar6 = uVar6 - 1 & uVar6;
        uVar8 = (ulong)uVar6;
      } while (uVar6 != 0);
    }
    auVar2 = vpsignb_avx(local_58,local_58);
    if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar2[0xf] < '\0') {
      pcVar9 = (ctrl_t *)(*(long *)this + *(long *)(this + 0x18));
LAB_0016d709:
      iVar12.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_1)
           (anon_union_8_1_a8a14541_for_iterator_1)unaff_RBP.slot_;
      iVar12.ctrl_ = pcVar9;
      return iVar12;
    }
    uVar10 = lVar7 + 0x10 + uVar10;
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

iterator find(const key_arg<K>& key, size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (int i : g.Match(H2(hash))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset(i)))))
                    return iterator_at(seq.offset(i));
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) 
                return end();
            seq.next();
        }
    }